

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O2

int ly_write_skipped(lyout *out,size_t position,char *buf,size_t count)

{
  size_t *psVar1;
  LYOUT_TYPE LVar2;
  uint uVar3;
  
  LVar2 = out->type;
  if ((LVar2 < LYOUT_MEMORY) || (LVar2 == LYOUT_CALLBACK)) {
    if (out->buf_len < count + position) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer.c"
             ,0x107);
      count = 0xffffffffffffffff;
    }
    else {
      memcpy(out->buffered + position,buf,count);
      psVar1 = &out->hole_count;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) {
        uVar3 = ly_write(out,out->buffered,out->buf_len);
        count = (size_t)uVar3;
        out->buf_len = 0;
      }
    }
  }
  else if (LVar2 == LYOUT_MEMORY) {
    memcpy((void *)((long)&((out->method).f)->_flags + position),buf,count);
  }
  return (int)count;
}

Assistant:

int
ly_write_skipped(struct lyout *out, size_t position, const char *buf, size_t count)
{
    switch (out->type) {
    case LYOUT_MEMORY:
        /* write */
        memcpy(&out->method.mem.buf[position], buf, count);
        break;
    case LYOUT_FD:
    case LYOUT_STREAM:
    case LYOUT_CALLBACK:
        if (out->buf_len < position + count) {
            LOGINT(NULL);
            return -1;
        }

        /* write into the hole */
        memcpy(&out->buffered[position], buf, count);

        /* decrease hole counter */
        --out->hole_count;

        if (!out->hole_count) {
            /* all holes filled, we can write the buffer */
            count = ly_write(out, out->buffered, out->buf_len);
            out->buf_len = 0;
        }
        break;
    }

    return count;
}